

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::AMRLink::AMRLink(AMRLink *this)

{
  Bounds<int> *in_RDI;
  int in_stack_fffffffffffffeec;
  Bounds<int> *in_stack_fffffffffffffef0;
  Bounds *in_stack_ffffffffffffff80;
  Bounds *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  AMRLink *in_stack_ffffffffffffffa0;
  
  Bounds<int>::Bounds(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  Bounds<int>::Bounds(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  AMRLink(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
          in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Bounds<int>::~Bounds(in_RDI);
  Bounds<int>::~Bounds(in_RDI);
  return;
}

Assistant:

int           dimension() const                       { return dim_; }